

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessauthenticationmanager.cpp
# Opt level: O2

QByteArray * authenticationKey(QByteArray *__return_storage_ptr__,QUrl *url,QString *realm)

{
  long lVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_68;
  QStringBuilder<const_char_(&)[6],_QByteArray> local_50;
  QUrl copy;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  copy.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl(&copy,url);
  QUrl::setFragment((QString *)&copy,(ParsingMode)realm);
  QUrl::toEncoded(&local_68,&copy,0x62);
  local_50.b.d.size = local_68.size;
  local_50.b.d.ptr = local_68.ptr;
  local_50.b.d.d = local_68.d;
  local_50.a = (char (*) [6])0x23ca7e;
  local_68.d = (Data *)0x0;
  local_68.ptr = (char *)0x0;
  local_68.size = 0;
  QStringBuilder<const_char_(&)[6],_QByteArray>::convertTo<QByteArray>
            (__return_storage_ptr__,&local_50);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_50.b.d);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
  QUrl::~QUrl(&copy);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static inline QByteArray authenticationKey(const QUrl &url, const QString &realm)
{
    QUrl copy = url;
    copy.setFragment(realm);
    return "auth:" + copy.toEncoded(QUrl::RemovePassword | QUrl::RemovePath | QUrl::RemoveQuery);
}